

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# param-utils.cpp
# Opt level: O0

void __thiscall
wasm::ParamUtils::localizeCallsTo(std::unordered_set<wasm::HeapType,std::hash<wasm::HeapType>,std::
equal_to<wasm::HeapType>,std::allocator<wasm::HeapType>>const&,wasm::Module&,wasm::PassRunner*)::
LocalizerPass::handleCall(wasm::Expression*,wasm::HeapType_
          (void *this,Expression *call,HeapType type)

{
  undefined8 parent;
  size_type sVar1;
  Function *func;
  Module *wasm;
  PassOptions *options;
  Expression *expression;
  Expression *replacement;
  ChildLocalizer localizer;
  Expression *call_local;
  LocalizerPass *this_local;
  HeapType type_local;
  
  localizer._40_8_ = call;
  this_local = (LocalizerPass *)type.id;
  sVar1 = std::
          unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>
          ::count(*(unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>
                    **)((long)this + 0x130),(key_type *)&this_local);
  parent = localizer._40_8_;
  if (sVar1 != 0) {
    func = Walker<LocalizerPass,_wasm::Visitor<LocalizerPass,_void>_>::getFunction
                     ((Walker<LocalizerPass,_wasm::Visitor<LocalizerPass,_void>_> *)
                      ((long)this + 0x58));
    wasm = Walker<LocalizerPass,_wasm::Visitor<LocalizerPass,_void>_>::getModule
                     ((Walker<LocalizerPass,_wasm::Visitor<LocalizerPass,_void>_> *)
                      ((long)this + 0x58));
    options = Pass::getPassOptions((Pass *)this);
    ChildLocalizer::ChildLocalizer
              ((ChildLocalizer *)&replacement,(Expression *)parent,func,wasm,options);
    expression = ChildLocalizer::getReplacement((ChildLocalizer *)&replacement);
    if (expression != (Expression *)localizer._40_8_) {
      Walker<LocalizerPass,_wasm::Visitor<LocalizerPass,_void>_>::replaceCurrent
                ((Walker<LocalizerPass,_wasm::Visitor<LocalizerPass,_void>_> *)((long)this + 0x58),
                 expression);
      *(undefined1 *)((long)this + 0x138) = 1;
    }
    ChildLocalizer::~ChildLocalizer((ChildLocalizer *)&replacement);
  }
  return;
}

Assistant:

void handleCall(Expression* call, HeapType type) {
      if (!callTargets.count(type)) {
        return;
      }

      ChildLocalizer localizer(
        call, getFunction(), *getModule(), getPassOptions());
      auto* replacement = localizer.getReplacement();
      if (replacement != call) {
        replaceCurrent(replacement);
        optimized = true;
      }
    }